

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-ir-builder.cpp
# Opt level: O3

Result<wasm::Ok> * __thiscall
wasm::IRBuilder::visitBlockStart
          (Result<wasm::Ok> *__return_storage_ptr__,IRBuilder *this,Block *curr,Type inputType)

{
  _Variadic_union<wasm::IRBuilder::ScopeCtx::NoScope,_wasm::IRBuilder::ScopeCtx::FuncScope,_wasm::IRBuilder::ScopeCtx::BlockScope,_wasm::IRBuilder::ScopeCtx::IfScope,_wasm::IRBuilder::ScopeCtx::ElseScope,_wasm::IRBuilder::ScopeCtx::LoopScope,_wasm::IRBuilder::ScopeCtx::TryScope,_wasm::IRBuilder::ScopeCtx::CatchScope,_wasm::IRBuilder::ScopeCtx::CatchAllScope,_wasm::IRBuilder::ScopeCtx::TryTableScope>
  local_d8;
  undefined1 local_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined1 local_98;
  uintptr_t local_90;
  undefined4 local_88;
  void *local_80;
  undefined8 uStack_78;
  long local_70;
  void *pvStack_68;
  undefined8 local_60;
  long lStack_58;
  void *local_50;
  undefined1 uStack_48;
  undefined7 uStack_47;
  undefined1 local_40;
  undefined7 uStack_3f;
  undefined1 uStack_38;
  undefined8 local_30;
  
  applyDebugLoc(this,(Expression *)curr);
  local_c0 = 2;
  local_b8 = 0;
  uStack_b0 = 0;
  local_a8 = 0;
  uStack_a0 = 0;
  local_98 = 0;
  local_88 = 0xffffffff;
  local_30 = 0;
  local_80 = (void *)0x0;
  uStack_78 = 0;
  local_70 = 0;
  pvStack_68 = (void *)0x0;
  local_60 = 0;
  lStack_58 = 0;
  local_50 = (void *)0x0;
  uStack_48 = 0;
  uStack_47 = 0;
  local_40 = 0;
  uStack_3f = 0;
  uStack_38 = 0;
  local_d8._0_8_ = curr;
  local_90 = inputType.id;
  pushScope(__return_storage_ptr__,this,(ScopeCtx *)&local_d8);
  if (local_50 != (void *)0x0) {
    operator_delete(local_50,CONCAT71(uStack_3f,local_40) - (long)local_50);
  }
  if (pvStack_68 != (void *)0x0) {
    operator_delete(pvStack_68,lStack_58 - (long)pvStack_68);
  }
  if (local_80 != (void *)0x0) {
    operator_delete(local_80,local_70 - (long)local_80);
  }
  return __return_storage_ptr__;
}

Assistant:

Result<> IRBuilder::visitBlockStart(Block* curr, Type inputType) {
  applyDebugLoc(curr);
  return pushScope(ScopeCtx::makeBlock(curr, inputType));
}